

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestResult.cpp
# Opt level: O2

bool __thiscall
CppUnit::TestResult::protect(TestResult *this,Functor *functor,Test *test,string *shortDescription)

{
  int iVar1;
  ProtectorContext context;
  Test *local_50;
  TestResult *local_48;
  string local_40 [32];
  
  local_50 = test;
  local_48 = this;
  std::__cxx11::string::string(local_40,(string *)shortDescription);
  iVar1 = (*(this->m_protectorChain->super_Protector)._vptr_Protector[2])
                    (this->m_protectorChain,functor,&local_50);
  std::__cxx11::string::~string(local_40);
  return SUB41(iVar1,0);
}

Assistant:

bool 
TestResult::protect( const Functor &functor,
                     Test *test,
                     const std::string &shortDescription )
{
  ProtectorContext context( test, this, shortDescription );
  return m_protectorChain->protect( functor, context );
}